

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O1

void __thiscall
NetworkNS::cb3D_integrator::calculate_pressure(cb3D_integrator *this,double *press_tens)

{
  uint uVar1;
  double **ppdVar2;
  double *pdVar3;
  uint j_1;
  ulong uVar4;
  uint j;
  long lVar5;
  
  press_tens[4] = 0.0;
  press_tens[5] = 0.0;
  press_tens[2] = 0.0;
  press_tens[3] = 0.0;
  *press_tens = 0.0;
  press_tens[1] = 0.0;
  uVar1 = this->dofs;
  if ((ulong)uVar1 != 0) {
    ppdVar2 = this->bd_stress;
    uVar4 = 0;
    do {
      pdVar3 = ppdVar2[uVar4];
      lVar5 = 0;
      do {
        press_tens[lVar5] = pdVar3[lVar5] + press_tens[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 6);
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar1);
  }
  lVar5 = 0;
  do {
    press_tens[lVar5] = press_tens[lVar5] * 16388.244964541722;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  return;
}

Assistant:

void cb3D_integrator::calculate_pressure(double *press_tens){
      /** A function which accumulates the per-atom stresses in order to calculate the pressure
       *  of the simulation box.
       */

      // Initialize the pressure tensor to zero.
      for (unsigned int j = 0; j < 6; j++)
         press_tens[j] = 0.0;
      
      /** The per-atom stress is the negative of the per-atom pressure tensor. It is also really a 
       *  stress*volume formulation, meaning the computed quantity is in units of pressure*volume:
       * @f[\frac{\rm kJ}{\rm mol} = \frac{10^{33}}{6.022 \times 10^{23}} 
       *    \frac{\rm kg}{\rm m\: s^2} @f]
       * Thus, if the diagonal components of the per-atom stress tensor are summed for all beads in 
       * the system and the sum is divided by @f$3 V@f$, where @f$ V @f$  is the volume of the 
       * system, the result should be @f$ -p @f$, where @f$ p @f$ is the total pressure of the 
       * system.
       */ 
      
      // Accumulated the per-atom pressures to the global tensor:
      for (unsigned int i = 0; i < dofs; i++)
         for (unsigned int j = 0; j < 6; j++)
            press_tens[j] += bd_stress[i][j];
      
      // Convert per-atom pressure*vol in atm*Angstrom
      // An interesting thread concerning loop unrolling in C++: 
      // http://stackoverflow.com/questions/15275023/clang-force-loop-unroll-for-specific-loop
      for (unsigned int j = 0; j < 6; j++)
         press_tens[j] *= 1.e33 / avogadro_constant / 101.325e3;
      
      return;
   }